

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O1

bool __thiscall QMimeData::hasUrls(QMimeData *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->super_QObject)._vptr_QObject[0xc])();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return SUB41(iVar2,0);
}

Assistant:

bool QMimeData::hasUrls() const
{
    return hasFormat(textUriListLiteral());
}